

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O2

bool Rml::ElementUtilities::SetClippingRegion(Element *element,bool force_clip_self)

{
  Rectanglei new_region;
  bool bVar1;
  Context *this;
  RenderManager *this_00;
  ClipMaskGeometryList clip_mask_list;
  Rectanglei clip_region;
  _Vector_base<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_> local_68;
  Rectanglei local_48;
  _Vector_base<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_> local_38;
  
  this = Element::GetContext(element);
  if (this != (Context *)0x0) {
    this_00 = Context::GetRenderManager(this);
    local_48.p0.x = 0;
    local_48.p0.y = 0;
    local_48.p1.x = 0;
    local_48.p1.y = 0;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = GetClippingRegion(element,&local_48,(ClipMaskGeometryList *)&local_68,force_clip_self);
    if (bVar1) {
      new_region.p1 = local_48.p1;
      new_region.p0 = local_48.p0;
      RenderManager::SetScissorRegion(this_00,new_region);
    }
    else {
      RenderManager::DisableScissorRegion(this_00);
    }
    local_38._M_impl.super__Vector_impl_data._M_start =
         local_68._M_impl.super__Vector_impl_data._M_start;
    local_38._M_impl.super__Vector_impl_data._M_finish =
         local_68._M_impl.super__Vector_impl_data._M_finish;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_68._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RenderManager::SetClipMask(this_00,(ClipMaskGeometryList *)&local_38);
    ::std::_Vector_base<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>::
    ~_Vector_base(&local_38);
    ::std::_Vector_base<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>::
    ~_Vector_base(&local_68);
  }
  return this != (Context *)0x0;
}

Assistant:

bool ElementUtilities::SetClippingRegion(Element* element, bool force_clip_self)
{
	Context* context = element->GetContext();
	if (!context)
		return false;

	RenderManager& render_manager = context->GetRenderManager();

	Rectanglei clip_region;
	ClipMaskGeometryList clip_mask_list;

	const bool scissoring_enabled = GetClippingRegion(element, clip_region, &clip_mask_list, force_clip_self);
	if (scissoring_enabled)
		render_manager.SetScissorRegion(clip_region);
	else
		render_manager.DisableScissorRegion();

	render_manager.SetClipMask(std::move(clip_mask_list));

	return true;
}